

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ioNative.cpp
# Opt level: O1

void chatra::emb::io::parsePositionArgs
               (Ct *ct,size_t offsetIndex,size_t lengthIndex,ptrdiff_t bufferSize,ptrdiff_t *offset,
               ptrdiff_t *length)

{
  int iVar1;
  undefined4 extraout_var;
  undefined8 uVar2;
  undefined4 extraout_var_00;
  undefined8 *puVar3;
  
  iVar1 = (*ct->_vptr_NativeCallContext[10])(ct,1);
  uVar2 = (**(code **)(*(long *)CONCAT44(extraout_var,iVar1) + 0x58))
                    ((long *)CONCAT44(extraout_var,iVar1));
  *(undefined8 *)lengthIndex = uVar2;
  iVar1 = (*ct->_vptr_NativeCallContext[10])(ct,2);
  uVar2 = (**(code **)(*(long *)CONCAT44(extraout_var_00,iVar1) + 0x58))
                    ((long *)CONCAT44(extraout_var_00,iVar1));
  *(undefined8 *)bufferSize = uVar2;
  if (*(long *)lengthIndex < 0) {
    *(size_t *)lengthIndex = *(long *)lengthIndex + offsetIndex;
  }
  if (-1 < *(long *)lengthIndex) {
    if (*(long *)bufferSize < 0) {
      *(size_t *)bufferSize = offsetIndex - *(long *)lengthIndex;
    }
    if ((-1 < *(long *)bufferSize) &&
       (*(long *)bufferSize + *(long *)lengthIndex <= (long)offsetIndex)) {
      return;
    }
  }
  puVar3 = (undefined8 *)__cxa_allocate_exception(0x28);
  *puVar3 = 0;
  puVar3[1] = 0;
  puVar3[2] = 0;
  puVar3[3] = 0;
  puVar3[4] = 0;
  puVar3[1] = puVar3 + 3;
  puVar3[2] = 0;
  *(undefined1 *)(puVar3 + 3) = 0;
  *puVar3 = &PTR__NativeException_00245b18;
  __cxa_throw(puVar3,&IllegalArgumentException::typeinfo,NativeException::~NativeException);
}

Assistant:

static void parsePositionArgs(Ct& ct, size_t offsetIndex, size_t lengthIndex, ptrdiff_t bufferSize,
		ptrdiff_t& offset, ptrdiff_t& length) {

	offset = ct.at(offsetIndex).get<ptrdiff_t>();
	length = ct.at(lengthIndex).get<ptrdiff_t>();

	if (offset < 0)
		offset = bufferSize + offset;
	if (offset < 0)
		throw IllegalArgumentException();
	if (length < 0)
		length = bufferSize - offset;
	if (length < 0 || offset + length > bufferSize)
		throw IllegalArgumentException();
}